

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O1

int __thiscall
CVmObjHTTPRequest::getp_getCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  long lVar1;
  int iVar2;
  ushort *puVar3;
  void *pvVar4;
  char *pcVar5;
  char cVar6;
  char *__s1;
  char *pcVar7;
  char *str;
  undefined8 *puVar8;
  size_t len;
  char *pcVar9;
  bool bVar10;
  long local_50;
  
  if (oargc == (uint *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (long)(int)*oargc;
  }
  if (getp_getCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getCookie();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getCookie::desc);
  if (iVar2 == 0) {
    lVar1 = *(long *)(*(long *)(this->super_CVmObject).ext_ + 0x58);
    puVar3 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    if (puVar3 == (ushort *)0x0) {
      err_throw(0x900);
    }
    retval->typ = VM_NIL;
    puVar8 = *(undefined8 **)(lVar1 + 0x10);
    if (puVar8 != (undefined8 *)0x0) {
      do {
        iVar2 = stricmp((char *)*puVar8,"cookie");
        if (iVar2 == 0) {
          pcVar7 = (char *)puVar8[1];
          do {
            if (*pcVar7 == '\0') {
              iVar2 = 5;
              break;
            }
            __s1 = pcVar7 + -1;
            pcVar9 = __s1;
            do {
              pcVar7 = __s1 + 1;
              __s1 = __s1 + 1;
              iVar2 = isspace((int)*pcVar7);
              pcVar9 = pcVar9 + 1;
            } while (iVar2 != 0);
            cVar6 = *__s1;
            pcVar5 = __s1;
            if (cVar6 == '\0') {
              bVar10 = false;
            }
            else {
              do {
                pvVar4 = memchr("=;,",(int)cVar6,4);
                if (pvVar4 != (void *)0x0) break;
                cVar6 = pcVar5[1];
                pcVar5 = pcVar5 + 1;
              } while (cVar6 != '\0');
              bVar10 = cVar6 == '=';
            }
            if (bVar10) {
              str = pcVar5 + 1;
              cVar6 = pcVar5[1];
              pcVar7 = str;
              while ((cVar6 != '\0' &&
                     (pvVar4 = memchr(" \t;,",(int)cVar6,5), pvVar4 == (void *)0x0))) {
                cVar6 = pcVar7[1];
                pcVar7 = pcVar7 + 1;
              }
              len = (long)pcVar7 - (long)str;
            }
            else {
              str = "";
              len = 0;
              pcVar7 = pcVar5;
            }
            if ((pcVar5 + -(ulong)*puVar3 == pcVar9) &&
               (iVar2 = bcmp(__s1,puVar3 + 1,(long)pcVar5 - (long)pcVar9), iVar2 == 0)) {
              bVar10 = false;
              new_parsed_str(retval,str,len,0);
              iVar2 = 0x10;
            }
            else {
              cVar6 = *pcVar7;
              while( true ) {
                bVar10 = true;
                iVar2 = 0;
                if ((cVar6 == '\0') ||
                   (pvVar4 = memchr(" \t;,",(int)cVar6,5), iVar2 = 0, bVar10 = true,
                   pvVar4 == (void *)0x0)) break;
                cVar6 = pcVar7[1];
                pcVar7 = pcVar7 + 1;
              }
            }
          } while (bVar10);
          if (iVar2 != 5) {
            if (iVar2 != 0x10) {
              return 1;
            }
            break;
          }
        }
        puVar8 = (undefined8 *)puVar8[2];
      } while (puVar8 != (undefined8 *)0x0);
    }
    sp_ = sp_ + -local_50;
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;

    /* get the cookie name argument */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    if (cname == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* presume we won't find a match */
    retval->set_nil();

    /* scan for "Cookie" headers */
    for (hdrs = hdrs->nxt ; hdrs != 0 ; hdrs = hdrs->nxt)
    {
        /* if this is a Cookie: header, process it */
        if (stricmp(hdrs->name, "cookie") == 0)
        {
            /* scan the list of cookie name=value pairs */
            for (const char *p = hdrs->value ; *p != '\0' ; )
            {
                /* skip leading whitespace */
                for ( ; isspace(*p) ; ++p) ;

                /* the cookie name ends at the '=', ';', ',', or null */
                const char *name = p;
                for ( ; *p != '\0' && strchr("=;,", *p) == 0 ; ++p) ;
                size_t namelen = p - name;

                /* if we found the '=', scan the value */
                const char *val = "";
                size_t vallen = 0;
                if (*p == '=')
                {
                    /* skip the '=' and scan for the end of the cookie */
                    for (val = ++p ; *p != '\0' && strchr(" \t;,", *p) == 0 ;
                         ++p) ;
                    vallen = p - val;
                }

                /* if this matches the name we're looking for, return it */
                if (namelen == vmb_get_len(cname)
                    && memcmp(name, cname + VMB_LEN, namelen) == 0)
                {
                    /* it's a match - return the value as a string */
                    new_parsed_str(vmg_ retval, val, vallen, ENCMODE_NONE);

                    /* stop looking */
                    goto done;
                }
                
                /* scan ahead to the next non-delimiter */
                for ( ; *p != '\0' && strchr(" \t;,", *p) != 0 ; ++p) ;
            }
        }
    }

done:
    /* done with the arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}